

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O3

void Ivy_ObjDisconnect(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0xbb,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
  if (((3 < uVar1 - 1) && (uVar1 != 7)) && (pObj->pFanin1 < (Ivy_Obj_t *)0x2)) {
    __assert_fail("Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || Ivy_ObjFanin1(pObj) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0xbc,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
    pIVar2 = (Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (pIVar2->nRefs < 1) goto LAB_007607b6;
    pIVar2->nRefs = pIVar2->nRefs + -1;
    if (p->fFanout != 0) {
      Ivy_ObjDeleteFanout(p,pIVar2,pObj);
    }
  }
  if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
    pIVar2 = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (pIVar2->nRefs < 1) {
LAB_007607b6:
      __assert_fail("pObj->nRefs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                    ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
    }
    pIVar2->nRefs = pIVar2->nRefs + -1;
    if (p->fFanout != 0) {
      Ivy_ObjDeleteFanout(p,pIVar2,pObj);
    }
  }
  if (pObj->pNextFan0 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pNextFan0 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0xca,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pNextFan1 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pNextFan1 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0xcb,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pPrevFan0 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pPrevFan0 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0xcc,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pPrevFan1 == (Ivy_Obj_t *)0x0) {
    Ivy_TableDelete(p,pObj);
    pObj->pFanin0 = (Ivy_Obj_t *)0x0;
    pObj->pFanin1 = (Ivy_Obj_t *)0x0;
    return;
  }
  __assert_fail("pObj->pPrevFan1 == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                ,0xcd,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ObjDisconnect( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || Ivy_ObjFanin1(pObj) != NULL );
    // remove connections
    if ( pObj->pFanin0 != NULL )
    {
        Ivy_ObjRefsDec(Ivy_ObjFanin0(pObj));
        if ( p->fFanout )
            Ivy_ObjDeleteFanout( p, Ivy_ObjFanin0(pObj), pObj );
    }
    if ( pObj->pFanin1 != NULL )
    {
        Ivy_ObjRefsDec(Ivy_ObjFanin1(pObj));
        if ( p->fFanout )
            Ivy_ObjDeleteFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
    assert( pObj->pNextFan0 == NULL );
    assert( pObj->pNextFan1 == NULL );
    assert( pObj->pPrevFan0 == NULL );
    assert( pObj->pPrevFan1 == NULL );
    // remove the node from the structural hash table
    Ivy_TableDelete( p, pObj );
    // add the first fanin
    pObj->pFanin0 = NULL;
    pObj->pFanin1 = NULL;
}